

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Builder::Builder(Builder *this,Builder *that)

{
  bool bVar1;
  element_type *peVar2;
  uchar *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RSI;
  Buffer<unsigned_char> *in_RDI;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *unaff_retaddr;
  shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *in_stack_ffffffffffffffc8;
  arena<64UL,_8UL> *this_00;
  shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *in_stack_ffffffffffffffd0;
  Builder *this_01;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  Buffer<unsigned_char> *__n;
  
  local_10._M_pi = in_RSI;
  __n = in_RDI;
  std::shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_>::shared_ptr
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  in_RDI->_size = 0;
  *(pointer *)in_RDI->_local = (pointer)0x0;
  *(_func_int ***)((long)in_RDI->_local + 8) = local_10._M_pi[2]._vptr__Sp_counted_base;
  this_00 = (arena<64UL,_8UL> *)((long)in_RDI->_local + 0x10);
  arena<64UL,_8UL>::arena(this_00);
  this_02 = (vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
             *)((long)in_RDI->_local + 0x58);
  this_01 = (Builder *)&stack0xffffffffffffffe8;
  short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>::short_alloc
            ((short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL> *)this_01,this_00)
  ;
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::vector((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
            *)this_01,(allocator_type *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  *(byte *)((long)in_RDI->_local + 0x90) = (byte)local_10._M_pi[10]._M_use_count & 1;
  *(_func_int ***)((long)in_RDI->_local + 0x98) = local_10._M_pi[0xb]._vptr__Sp_counted_base;
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::reserve(unaff_retaddr,(size_type)__n);
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::operator=(this_02,(vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                       *)in_RDI);
  bVar1 = std::operator==(&this_01->_buffer,this_00);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    in_RDI->_size = (ValueLength)local_10._M_pi[1]._vptr__Sp_counted_base;
  }
  else {
    peVar2 = std::
             __shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::
             get((__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                  *)in_RDI);
    in_RDI->_size = (ValueLength)peVar2;
  }
  if (in_RDI->_size != 0) {
    puVar3 = Buffer<unsigned_char>::data((Buffer<unsigned_char> *)in_RDI->_size);
    *(uchar **)in_RDI->_local = puVar3;
  }
  local_10._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  clear(this_01);
  return;
}

Assistant:

Builder::Builder(Builder&& that) noexcept
    : _buffer(std::move(that._buffer)),
      _bufferPtr(nullptr),
      _start(nullptr),
      _pos(that._pos),
      _arena(),
      _stack(_arena),
      _indexes(std::move(that._indexes)),
      _keyWritten(that._keyWritten),
      options(that.options) {
  // do a full initial allocation in the arena, so we can maximize its usage
  _stack.reserve(arenaSize / sizeof(decltype(_stack)::value_type));
  _stack = std::move(that._stack);

  if (_buffer != nullptr) {
    _bufferPtr = _buffer.get();
  } else {
    _bufferPtr = that._bufferPtr;
  }
  if (_bufferPtr != nullptr) {
    _start = _bufferPtr->data();
  }
  VELOCYPACK_ASSERT(that._buffer == nullptr);
  that._bufferPtr = nullptr;
  that.clear();
}